

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

MempoolAcceptResult * __thiscall
ChainstateManager::ProcessTransaction
          (MempoolAcceptResult *__return_storage_ptr__,ChainstateManager *this,CTransactionRef *tx,
          bool test_accept)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  CTxMemPool *this_00;
  TxValidationState state_00;
  Chainstate *active_chainstate;
  int64_t accept_time;
  CCoinsViewCache *active_coins_tip;
  long in_FS_OFFSET;
  TxValidationState state;
  undefined8 uVar3;
  undefined1 *puVar4;
  undefined8 in_stack_ffffffffffffff08;
  long in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  undefined1 *puVar5;
  undefined8 in_stack_ffffffffffffff28;
  long in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  string local_c0;
  string local_a0;
  ValidationState<TxValidationResult> local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  active_chainstate = ActiveChainstate(this);
  if (active_chainstate->m_mempool == (CTxMemPool *)0x0) {
    paVar1 = &local_80.m_reject_reason.field_2;
    local_80.m_mode = M_VALID;
    local_80.m_result = TX_RESULT_UNSET;
    local_80.m_reject_reason._M_string_length = 0;
    local_80.m_reject_reason.field_2._M_local_buf[0] = '\0';
    paVar2 = &local_80.m_debug_message.field_2;
    local_80.m_debug_message._M_string_length = 0;
    local_80.m_debug_message.field_2._M_local_buf[0] = '\0';
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_80.m_reject_reason._M_dataplus._M_p = (pointer)paVar1;
    local_80.m_debug_message._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"no-mempool","");
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
    ValidationState<TxValidationResult>::Invalid(&local_80,TX_NO_MEMPOOL,&local_a0,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    uVar3 = local_80._0_8_;
    puVar4 = &stack0xffffffffffffff10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&stack0xffffffffffffff00,local_80.m_reject_reason._M_dataplus._M_p,
               local_80.m_reject_reason._M_dataplus._M_p + local_80.m_reject_reason._M_string_length
              );
    puVar5 = &stack0xffffffffffffff30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&stack0xffffffffffffff20,local_80.m_debug_message._M_dataplus._M_p,
               local_80.m_debug_message._M_dataplus._M_p + local_80.m_debug_message._M_string_length
              );
    state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p = puVar4;
    state_00.super_ValidationState<TxValidationResult>.m_mode = (ModeState)uVar3;
    state_00.super_ValidationState<TxValidationResult>.m_result = SUB84(uVar3,4);
    state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length =
         in_stack_ffffffffffffff08;
    state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_allocated_capacity
         = in_stack_ffffffffffffff10;
    state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
         in_stack_ffffffffffffff18;
    state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p = puVar5;
    state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
         in_stack_ffffffffffffff28;
    state_00.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_allocated_capacity
         = in_stack_ffffffffffffff30;
    state_00.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
         in_stack_ffffffffffffff38;
    MempoolAcceptResult::Failure(__return_storage_ptr__,state_00);
    if (puVar5 != &stack0xffffffffffffff30) {
      operator_delete(puVar5,in_stack_ffffffffffffff30 + 1);
    }
    if (puVar4 != &stack0xffffffffffffff10) {
      operator_delete(puVar4,in_stack_ffffffffffffff10 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.m_debug_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_80.m_debug_message._M_dataplus._M_p,
                      CONCAT71(local_80.m_debug_message.field_2._M_allocated_capacity._1_7_,
                               local_80.m_debug_message.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.m_reject_reason._M_dataplus._M_p != paVar1) {
      operator_delete(local_80.m_reject_reason._M_dataplus._M_p,
                      CONCAT71(local_80.m_reject_reason.field_2._M_allocated_capacity._1_7_,
                               local_80.m_reject_reason.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    accept_time = GetTime();
    AcceptToMemoryPool(__return_storage_ptr__,active_chainstate,tx,accept_time,false,test_accept);
    this_00 = active_chainstate->m_mempool;
    active_coins_tip = Chainstate::CoinsTip(active_chainstate);
    CTxMemPool::check(this_00,active_coins_tip,
                      (long)(int)((ulong)((long)(active_chainstate->m_chain).vChain.
                                                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(active_chainstate->m_chain).vChain.
                                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

MempoolAcceptResult ChainstateManager::ProcessTransaction(const CTransactionRef& tx, bool test_accept)
{
    AssertLockHeld(cs_main);
    Chainstate& active_chainstate = ActiveChainstate();
    if (!active_chainstate.GetMempool()) {
        TxValidationState state;
        state.Invalid(TxValidationResult::TX_NO_MEMPOOL, "no-mempool");
        return MempoolAcceptResult::Failure(state);
    }
    auto result = AcceptToMemoryPool(active_chainstate, tx, GetTime(), /*bypass_limits=*/ false, test_accept);
    active_chainstate.GetMempool()->check(active_chainstate.CoinsTip(), active_chainstate.m_chain.Height() + 1);
    return result;
}